

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O1

void Dau_DsdMergeSubstitute_rec
               (Dau_Sto_t *pS,char *pStr,char **p,int *pMatches,int *pStatus,int fWrite)

{
  char **ppcVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  int *piVar12;
  char **ppcVar13;
  ulong uVar14;
  char **ppcVar15;
  
  if (**p == '!') {
    if (fWrite != 0) {
      pcVar6 = pS->pPosOutput;
      pS->pPosOutput = pcVar6 + 1;
      *pcVar6 = '!';
    }
    *p = *p + 1;
  }
  pcVar6 = *p;
  cVar10 = *pcVar6;
  if ((byte)(cVar10 + 0xbfU) < 6 || (byte)(cVar10 - 0x30U) < 10) {
    do {
      if (fWrite != 0) {
        pcVar6 = pS->pPosOutput;
        pS->pPosOutput = pcVar6 + 1;
        *pcVar6 = cVar10;
      }
      pcVar7 = *p;
      pcVar6 = pcVar7 + 1;
      *p = pcVar6;
      cVar10 = pcVar7[1];
    } while ((byte)(cVar10 - 0x30U) < 10 || (byte)(cVar10 + 0xbfU) < 6);
  }
  if ((cVar10 == '<') &&
     (lVar11 = (long)pMatches[(long)pcVar6 - (long)pStr], pStr[lVar11 + 1] == '{')) {
    *p = pStr + lVar11 + 1;
    if ((fWrite != 0) && (pcVar6 < pStr + lVar11 + 1)) {
      pcVar6 = pcVar6 + -1;
      do {
        cVar10 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
        pcVar7 = pS->pPosOutput;
        pS->pPosOutput = pcVar7 + 1;
        *pcVar7 = cVar10;
      } while (pcVar6 < pStr + lVar11);
    }
  }
  bVar2 = **p;
  if ((byte)(bVar2 + 0x9f) < 0x1a) {
    if (fWrite != 0) {
      pbVar5 = (byte *)pS->pPosOutput;
      pS->pPosOutput = (char *)(pbVar5 + 1);
      *pbVar5 = bVar2;
    }
  }
  else {
    if (((0x3f < bVar2 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar2 - 0x3c) & 0x3f) & 1) == 0)
        ) && (bVar2 != 0x28)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x1ec,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    lVar11 = (long)*p - (long)pStr;
    if ((int)(char)bVar2 + (uint)(bVar2 != 0x28) + 1 != (int)pStr[pMatches[lVar11]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x19f,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    iVar3 = pStatus[lVar11];
    pcVar6 = pStr + pMatches[lVar11];
    if (fWrite == 0) {
      if (iVar3 != 3) {
        __assert_fail("Status == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1a2,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
      *p = pcVar6;
    }
    else if (iVar3 == 0) {
      pbVar5 = (byte *)pS->pPosOutput;
      pS->pPosOutput = (char *)(pbVar5 + 1);
      *pbVar5 = bVar2;
      while( true ) {
        pcVar7 = *p + 1;
        *p = pcVar7;
        if (pcVar6 <= pcVar7) break;
        if (*pcVar7 == '!') {
          pcVar7 = pS->pPosOutput;
          pS->pPosOutput = pcVar7 + 1;
          *pcVar7 = '!';
          *p = *p + 1;
        }
        Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,1);
      }
      cVar10 = *pcVar7;
      pcVar7 = pS->pPosOutput;
      pS->pPosOutput = pcVar7 + 1;
      *pcVar7 = cVar10;
      if (*p != pcVar6) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1b4,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
    }
    else {
      if (iVar3 != 1) {
        if (iVar3 == 3) {
          __assert_fail("Status != 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x1a6,
                        "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                       );
        }
        if ((bVar2 != 0x7b) && (bVar2 != 0x3c)) {
          if (iVar3 == 2) {
            pbVar5 = (byte *)pS->pPosOutput;
            pS->pPosOutput = (char *)(pbVar5 + 1);
            *pbVar5 = bVar2;
            cVar10 = **p;
            iVar3 = pS->iVarUsed;
            ppcVar15 = pS->pPosStore + iVar3;
            *ppcVar15 = pS->pStore[iVar3];
            if (cVar10 != '\0') {
              *ppcVar15 = pS->pStore[iVar3] + 1;
              pS->pStore[iVar3][0] = cVar10;
            }
            ppcVar1 = &pS->pPosOutput;
            pS->iVarUsed = iVar3 + 1;
            pcVar9 = *p;
            pcVar7 = pcVar9 + 1;
            *p = pcVar7;
            if (pcVar7 < pcVar6) {
              do {
                uVar14 = (ulong)(pcVar9[1] == '!');
                pcVar8 = pcVar7 + (uVar14 - 1);
                piVar12 = pMatches + (long)(pcVar7 + (uVar14 - (long)pStr) + -1);
                do {
                  cVar10 = pcVar8[1];
                  pcVar8 = pcVar8 + 1;
                  piVar12 = piVar12 + 1;
                } while ((byte)(cVar10 - 0x30U) < 10 || (byte)(cVar10 + 0xbfU) < 6);
                if ((cVar10 == '<') && (pStr[(long)*piVar12 + 1] == '{')) {
                  pcVar8 = pStr + (long)*piVar12 + 1;
                }
                iVar4 = pStatus[(long)pcVar8 - (long)pStr];
                if (pcVar9[1] == '!') {
                  ppcVar13 = ppcVar1;
                  if (iVar4 == 3) {
                    ppcVar13 = ppcVar15;
                  }
                  pcVar7 = *ppcVar13;
                  *ppcVar13 = pcVar7 + 1;
                  *pcVar7 = '!';
                  *p = *p + 1;
                  pcVar7 = pcVar9 + 2;
                }
                Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar4 != 3));
                if ((iVar4 == 3) && (pcVar9 = *p, pcVar7 < pcVar9 + 1)) {
                  pcVar7 = pcVar7 + -1;
                  do {
                    cVar10 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                    pcVar8 = *ppcVar15;
                    *ppcVar15 = pcVar8 + 1;
                    *pcVar8 = cVar10;
                  } while (pcVar7 != pcVar9);
                }
                pcVar9 = *p;
                pcVar7 = pcVar9 + 1;
                *p = pcVar7;
              } while (pcVar7 < pcVar6);
            }
            cVar10 = *pcVar6;
            if (cVar10 != '\0') {
              pcVar6 = *ppcVar15;
              *ppcVar15 = pcVar6 + 1;
              *pcVar6 = cVar10;
            }
            pcVar6 = *ppcVar15;
            *ppcVar15 = pcVar6 + 1;
            *pcVar6 = '\0';
            pcVar6 = *ppcVar1;
            *ppcVar1 = pcVar6 + 1;
            *pcVar6 = (char)iVar3 + 'a';
            cVar10 = **p;
            pcVar6 = *ppcVar1;
            *ppcVar1 = pcVar6 + 1;
            *pcVar6 = cVar10;
            return;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x1e9,
                        "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                       );
        }
      }
      pbVar5 = (byte *)pS->pPosOutput;
      pS->pPosOutput = (char *)(pbVar5 + 1);
      *pbVar5 = bVar2;
      pcVar7 = *p + 1;
      *p = pcVar7;
      if (pcVar7 < pcVar6) {
        do {
          if (*pcVar7 == '!') {
            pcVar7 = pS->pPosOutput;
            pS->pPosOutput = pcVar7 + 1;
            *pcVar7 = '!';
            *p = *p + 1;
          }
          pcVar9 = *p;
          pcVar7 = pcVar9 + -1;
          pcVar8 = pcVar9 + ((ulong)(*pcVar9 == '!') - 1);
          piVar12 = pMatches + (long)(pcVar9 + ((ulong)(*pcVar9 == '!') - (long)pStr) + -1);
          do {
            cVar10 = pcVar8[1];
            pcVar8 = pcVar8 + 1;
            piVar12 = piVar12 + 1;
          } while ((byte)(cVar10 - 0x30U) < 10 || (byte)(cVar10 + 0xbfU) < 6);
          if ((cVar10 == '<') && (pStr[(long)*piVar12 + 1] == '{')) {
            pcVar8 = pStr + (long)*piVar12 + 1;
          }
          iVar3 = pStatus[(long)pcVar8 - (long)pStr];
          Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar3 != 3));
          if (iVar3 == 3) {
            pcVar8 = *p;
            iVar3 = pS->iVarUsed;
            pS->pPosStore[iVar3] = pS->pStore[iVar3];
            pS->iVarUsed = iVar3 + 1;
            if (pcVar9 < pcVar8 + 1) {
              do {
                cVar10 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
                pcVar9 = pS->pPosStore[iVar3];
                pS->pPosStore[iVar3] = pcVar9 + 1;
                *pcVar9 = cVar10;
              } while (pcVar7 != pcVar8);
            }
            pcVar7 = pS->pPosStore[iVar3];
            pS->pPosStore[iVar3] = pcVar7 + 1;
            *pcVar7 = '\0';
            pcVar7 = pS->pPosOutput;
            pS->pPosOutput = pcVar7 + 1;
            *pcVar7 = (char)iVar3 + 'a';
          }
          pcVar7 = *p + 1;
          *p = pcVar7;
        } while (pcVar7 < pcVar6);
      }
      cVar10 = *pcVar7;
      pcVar7 = pS->pPosOutput;
      pS->pPosOutput = pcVar7 + 1;
      *pcVar7 = cVar10;
      if (*p != pcVar6) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1cb,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
    }
  }
  return;
}

Assistant:

void Dau_DsdMergeSubstitute_rec( Dau_Sto_t * pS, char * pStr, char ** p, int * pMatches, int * pStatus, int fWrite )
{
//    assert( **p != '!' );

    if ( **p == '!' )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }

    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            if ( fWrite )
                for ( ; pTemp < q+1; pTemp++ )
                    Dau_DsdMergeStoreAddToOutputChar( pS, *pTemp );
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        return;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int New, StatusFan, Status = pStatus[*p - pStr];
        char * pBeg, * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( !fWrite )
        {
             assert( Status == 3 );
             *p = q;
             return;
        }
        assert( Status != 3 );
        if ( Status == 0 ) // none pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, 1 );
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 1 || **p == '<' || **p == '{' ) // 1 pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                {
                    int New = Dau_DsdMergeStoreCreateDef( pS, pBeg, *p+1 );
                    Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
                }
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 2 )
        {
            // add more than one defs
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            New = Dau_DsdMergeStoreStartDef( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                if ( **p == '!' )
                {
                    if ( StatusFan != 3 )
                        Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    else
                        Dau_DsdMergeStoreAddToDefChar( pS, New, '!' );
                    (*p)++;
                    pBeg++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                    Dau_DsdMergeStoreAddToDef( pS, New, pBeg, *p+1 );
            }
            Dau_DsdMergeStoreStopDef( pS, New, *q );
            Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            return;
        }
        assert( 0 );
        return;
    }
    assert( 0 );
}